

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::InternalIsFileLoaded(DescriptorPool *this,string *filename)

{
  FileDescriptor *pFVar1;
  string *in_RDI;
  byte bVar2;
  MutexLockMaybe lock;
  Mutex *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  Tables *in_stack_ffffffffffffffd0;
  
  internal::MutexLockMaybe::MutexLockMaybe
            ((MutexLockMaybe *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4aa373);
  pFVar1 = Tables::FindFile(in_stack_ffffffffffffffd0,in_RDI);
  bVar2 = pFVar1 != (FileDescriptor *)0x0;
  internal::MutexLockMaybe::~MutexLockMaybe
            ((MutexLockMaybe *)CONCAT17(bVar2,in_stack_ffffffffffffffc0));
  return (bool)(bVar2 & 1);
}

Assistant:

bool DescriptorPool::InternalIsFileLoaded(const std::string& filename) const {
  MutexLockMaybe lock(mutex_);
  return tables_->FindFile(filename) != nullptr;
}